

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O3

void __thiscall DecisionNode::chooseOptimalField(DecisionNode *this)

{
  bool bVar1;
  int4 iVar2;
  int4 iVar3;
  int4 iVar4;
  uint size;
  int4 maxfixed;
  int4 iVar5;
  int iVar6;
  bool bVar7;
  double dVar8;
  double local_38;
  
  iVar5 = 1;
  local_38 = 0.0;
  bVar1 = true;
  do {
    bVar7 = bVar1;
    iVar2 = getMaximumLength(this,bVar7);
    if (iVar2 != 0) {
      iVar6 = 0;
      do {
        iVar3 = getNumFixed(this,iVar6,1,bVar7);
        if (iVar5 <= iVar3) {
          dVar8 = getScore(this,iVar6,1,bVar7);
          if (((iVar5 < iVar3) && (0.0 < dVar8)) || (iVar3 = iVar5, local_38 < dVar8)) {
            iVar5 = iVar3;
            this->startbit = iVar6;
            this->bitsize = 1;
            this->contextdecision = bVar7;
            local_38 = dVar8;
          }
        }
        iVar6 = iVar6 + 1;
      } while (iVar2 * 8 + (uint)(iVar2 * 8 == 0) != iVar6);
    }
    bVar1 = false;
  } while (bVar7);
  bVar1 = true;
  do {
    iVar2 = getMaximumLength(this,bVar1);
    iVar6 = iVar2 * 8;
    size = 2;
    do {
      iVar6 = iVar6 + -1;
      if (size <= (uint)(iVar2 << 3)) {
        iVar3 = 0;
        do {
          iVar4 = getNumFixed(this,iVar3,size,bVar1);
          if (iVar5 <= iVar4) {
            dVar8 = getScore(this,iVar3,size,bVar1);
            if (local_38 < dVar8) {
              this->startbit = iVar3;
              this->bitsize = size;
              this->contextdecision = bVar1;
              local_38 = dVar8;
            }
          }
          iVar3 = iVar3 + 1;
        } while (iVar6 != iVar3);
      }
      size = size + 1;
    } while (size != 9);
    bVar7 = bVar1 != false;
    bVar1 = false;
  } while (bVar7);
  if (local_38 <= 0.0) {
    this->bitsize = 0;
  }
  return;
}

Assistant:

void DecisionNode::chooseOptimalField(void)

{
  double score = 0.0;
  
  int4 sbit,size;		// The current field
  bool context;
  double sc;

  int4 maxlength,numfixed,maxfixed;

  maxfixed = 1;
  context = true;
  do {
    maxlength = 8*getMaximumLength(context);
    for(sbit=0;sbit<maxlength;++sbit) {
      numfixed = getNumFixed(sbit,1,context); // How may patterns specify this bit
      if (numfixed < maxfixed) continue; // Skip this bit, if we don't have maximum specification
      sc = getScore(sbit,1,context);

 // if we got more patterns this time than previously, and a positive score, reset
 // the high score (we prefer this bit, because it has a higher numfixed, regardless
 // of the difference in score, as long as the new score is positive).
      if ((numfixed > maxfixed)&&(sc > 0.0)) {
	score = sc;
	maxfixed = numfixed;
	startbit = sbit;
	bitsize = 1;
	contextdecision = context;
	continue;
      }
				// We have maximum patterns
      if (sc > score) {
	score = sc;
	startbit = sbit;
	bitsize = 1;
	contextdecision = context;
      }
    }
    context = !context;
  } while(!context);

  context = true;
  do {
    maxlength = 8*getMaximumLength(context);
    for(size=2;size <= 8;++size) {
      for(sbit=0;sbit<maxlength-size+1;++sbit) {
	if (getNumFixed(sbit,size,context) < maxfixed) continue; // Consider only maximal fields
	sc = getScore(sbit,size,context);
	if (sc > score) {
	  score = sc;
	  startbit = sbit;
	  bitsize = size;
	  contextdecision = context;
	}
      }
    }
    context = !context;
  } while(!context);
  if (score <= 0.0)		// If we failed to get a positive score
    bitsize = 0;		// treat the node as terminal
}